

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c.cc
# Opt level: O2

int ProgramMain(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  Result RVar3;
  allocator<char> local_f9;
  Errors errors;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  OptionParser parser;
  
  wabt::InitStdio();
  wabt::OptionParser::OptionParser
            (&parser,"wasm2c",
             "  Read a file in the WebAssembly binary format, and convert it to\n  a C source file and header.\n\nexamples:\n  # parse binary file test.wasm and write test.c and test.h\n  $ wasm2c test.wasm -o test.c\n\n  # parse test.wasm, write test.c and test.h, but ignore the debug names, if any\n  $ wasm2c test.wasm --no-debug-names -o test.c\n"
            );
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:76:72)>
                ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'v',"verbose","Use multiple times for more info",(NullCallback *)&errors);
  if (errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(&errors,&errors,3);
  }
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:83:7)>
                ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'o',"output","FILENAME",
             "Output file for the generated C source file, by default use stdout",
             (Callback *)&errors);
  if (errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(&errors,&errors,3);
  }
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:89:7)>
                ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'\0',"num-outputs","NUM","Number of output files to write",(Callback *)&errors)
  ;
  if (errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(&errors,&errors,3);
  }
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:96:7)>
                ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,'n',"module-name","MODNAME",
             "Unique name for the module being generated. This name is prefixed to\neach of the generaed C symbols. By default, the module name from the\nnames section is used. If that is not present the name of the input\nfile is used as the default.\n"
             ,(Callback *)&errors);
  if (errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(&errors,&errors,3);
  }
  wabt::Features::AddOptions(&s_write_c_options.features,&parser);
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:99:20)>
                ::_M_manager;
  wabt::OptionParser::AddOption
            (&parser,"no-debug-names","Ignore debug names in the binary file",
             (NullCallback *)&errors);
  if (errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    (*(code *)errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(&errors,&errors,3);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&errors,"filename",&local_f9);
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c0 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:101:22)>
             ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/tools/wasm2c.cc:101:22)>
             ::_M_manager;
  bVar1 = false;
  wabt::OptionParser::AddArgument(&parser,(string *)&errors,One,(Callback *)&local_d8);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  std::__cxx11::string::_M_dispose();
  wabt::OptionParser::Parse(&parser,argc,argv);
  if (s_write_c_options.features.exceptions_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&errors,"exceptions",(allocator<char> *)local_d8._M_pod_data);
    bVar1 = IsFeatureSupported((string *)&errors);
    bVar1 = !bVar1;
    std::__cxx11::string::_M_dispose();
  }
  if (s_write_c_options.features.threads_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&errors,"threads",(allocator<char> *)local_d8._M_pod_data);
    bVar2 = IsFeatureSupported((string *)&errors);
    bVar1 = (bool)(bVar1 | !bVar2);
    std::__cxx11::string::_M_dispose();
  }
  if (s_write_c_options.features.function_references_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&errors,"function-references",(allocator<char> *)local_d8._M_pod_data);
    bVar2 = IsFeatureSupported((string *)&errors);
    bVar1 = (bool)(!bVar2 | bVar1);
    std::__cxx11::string::_M_dispose();
  }
  if (s_write_c_options.features.tail_call_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&errors,"tail-call",(allocator<char> *)local_d8._M_pod_data);
    bVar2 = IsFeatureSupported((string *)&errors);
    bVar1 = (bool)(bVar1 | !bVar2);
    std::__cxx11::string::_M_dispose();
  }
  if (s_write_c_options.features.annotations_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&errors,"annotations",(allocator<char> *)local_d8._M_pod_data);
    bVar2 = IsFeatureSupported((string *)&errors);
    bVar1 = (bool)(bVar1 | !bVar2);
    std::__cxx11::string::_M_dispose();
  }
  if (s_write_c_options.features.code_metadata_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&errors,"code-metadata",(allocator<char> *)local_d8._M_pod_data);
    bVar2 = IsFeatureSupported((string *)&errors);
    bVar1 = (bool)(bVar1 | !bVar2);
    std::__cxx11::string::_M_dispose();
  }
  if (s_write_c_options.features.gc_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&errors,"gc",(allocator<char> *)local_d8._M_pod_data);
    bVar2 = IsFeatureSupported((string *)&errors);
    bVar1 = (bool)(bVar1 | !bVar2);
    std::__cxx11::string::_M_dispose();
  }
  if (s_write_c_options.features.memory64_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&errors,"memory64",(allocator<char> *)local_d8._M_pod_data);
    bVar2 = IsFeatureSupported((string *)&errors);
    bVar1 = (bool)(bVar1 | !bVar2);
    std::__cxx11::string::_M_dispose();
  }
  if (s_write_c_options.features.multi_memory_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&errors,"multi-memory",(allocator<char> *)local_d8._M_pod_data);
    bVar2 = IsFeatureSupported((string *)&errors);
    bVar1 = (bool)(bVar1 | !bVar2);
    std::__cxx11::string::_M_dispose();
  }
  if (s_write_c_options.features.extended_const_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&errors,"extended-const",(allocator<char> *)local_d8._M_pod_data);
    bVar2 = IsFeatureSupported((string *)&errors);
    bVar1 = (bool)(bVar1 | !bVar2);
    std::__cxx11::string::_M_dispose();
  }
  if (s_write_c_options.features.relaxed_simd_enabled_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&errors,"relaxed-simd",(allocator<char> *)local_d8._M_pod_data);
    bVar2 = IsFeatureSupported((string *)&errors);
    bVar1 = (bool)(bVar1 | !bVar2);
    std::__cxx11::string::_M_dispose();
  }
  if (s_write_c_options.features.custom_page_sizes_enabled_ != false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&errors,"custom-page-sizes",(allocator<char> *)local_d8._M_pod_data);
    bVar2 = IsFeatureSupported((string *)&errors);
    std::__cxx11::string::_M_dispose();
    if (!bVar2) goto LAB_001153e0;
  }
  if (!bVar1) {
    wabt::OptionParser::~OptionParser(&parser);
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RVar3 = Wasm2cMain(&errors);
    parser.program_name_._M_dataplus._M_p = (pointer)&parser.program_name_.field_2;
    parser.program_name_._M_string_length = 0;
    parser.program_name_.field_2._M_local_buf[0] = '\0';
    wabt::FormatErrorsToFile
              (&errors,Binary,(LexerSourceLineFinder *)0x0,(FILE *)_stderr,&parser.program_name_,
               Never,0x50);
    std::__cxx11::string::_M_dispose();
    std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
    return (int)(RVar3.enum_ != Ok);
  }
LAB_001153e0:
  fwrite("wasm2c currently only supports a limited set of features.\n",0x3a,1,_stderr);
  exit(1);
}

Assistant:

int ProgramMain(int argc, char** argv) {
  Result result;

  InitStdio();
  ParseOptions(argc, argv);

  Errors errors;
  result = Wasm2cMain(errors);
  FormatErrorsToFile(errors, Location::Type::Binary);

  return result != Result::Ok;
}